

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O2

void read_agency(agency_t *record,int field_count,char **field_names,char **field_values)

{
  char *__s1;
  int iVar1;
  agency_t *__dest;
  ulong uVar2;
  ulong uVar3;
  
  init_agency(record);
  uVar2 = 0;
  uVar3 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      return;
    }
    __s1 = field_names[uVar2];
    iVar1 = strcmp(__s1,"agency_id");
    __dest = record;
    if (iVar1 == 0) {
LAB_00117896:
      strcpy(__dest->id,field_values[uVar2]);
    }
    else {
      iVar1 = strcmp(__s1,"agency_name");
      __dest = (agency_t *)record->name;
      if (iVar1 == 0) goto LAB_00117896;
      iVar1 = strcmp(__s1,"agency_url");
      __dest = (agency_t *)record->url;
      if (iVar1 == 0) goto LAB_00117896;
      iVar1 = strcmp(__s1,"agency_timezone");
      __dest = (agency_t *)record->timezone;
      if (iVar1 == 0) goto LAB_00117896;
      iVar1 = strcmp(__s1,"agency_lang");
      __dest = (agency_t *)record->lang;
      if (iVar1 == 0) goto LAB_00117896;
      iVar1 = strcmp(__s1,"agency_phone");
      __dest = (agency_t *)record->phone;
      if (iVar1 == 0) goto LAB_00117896;
      iVar1 = strcmp(__s1,"agency_fare_url");
      __dest = (agency_t *)record->fare_url;
      if (iVar1 == 0) goto LAB_00117896;
      iVar1 = strcmp(__s1,"agency_email");
      __dest = (agency_t *)record->email;
      if (iVar1 == 0) goto LAB_00117896;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void read_agency(agency_t *record, int field_count, const char **field_names, const char **field_values) {
    init_agency(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_timezone") == 0) {
            strcpy(record->timezone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_lang") == 0) {
            strcpy(record->lang, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_phone") == 0) {
            strcpy(record->phone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_fare_url") == 0) {
            strcpy(record->fare_url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_email") == 0) {
            strcpy(record->email, field_values[i]);
            continue;
        }
    }
}